

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_object.cpp
# Opt level: O2

global_object_create_result *
mjs::make_boolean_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  gc_heap *h;
  long *plVar1;
  function_object *pfVar2;
  void *pvVar3;
  gc_heap_ptr_untyped *this;
  long *plVar4;
  undefined1 local_110 [24];
  uint32_t local_f8;
  value p;
  object local_c8;
  gc_heap_ptr_untyped local_a8;
  gc_heap_ptr_untyped local_98;
  gc_heap_ptr<mjs::function_object> c;
  gc_heap_ptr<mjs::boolean_object> prototype;
  anon_class_32_2_842af841 get_bool_obj;
  gc_heap_ptr_untyped local_40;
  gc_heap_ptr_untyped local_30;
  
  h = (global->super_gc_heap_ptr_untyped).heap_;
  get_bool_obj.global.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x7;
  get_bool_obj.global.super_gc_heap_ptr_untyped._8_8_ = anon_var_dwarf_c1b13;
  string::string((string *)&p,h,(string_view *)&get_bool_obj);
  plVar1 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar1 + 0x58))(&local_c8,plVar1);
  local_110[0] = 0;
  gc_heap::make<mjs::boolean_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,bool>
            ((gc_heap *)&prototype,(string *)h,(gc_heap_ptr<mjs::object> *)&p,(bool *)&local_c8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
  object::class_name(&local_c8);
  make_raw_function((mjs *)&c,global);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  get_bool_obj.global.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
  get_bool_obj.global.super_gc_heap_ptr_untyped._8_8_ =
       get_bool_obj.global.super_gc_heap_ptr_untyped._8_8_ & 0xffffffff00000000;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)&p,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&p);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001c16b8;
  function_object::put_function
            (pfVar2,(gc_heap_ptr<mjs::gc_function> *)&p,(gc_heap_ptr<mjs::gc_string> *)&local_c8,
             (gc_heap_ptr<mjs::gc_string> *)&get_bool_obj,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&get_bool_obj);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)(local_110 + 0x10),&prototype.super_gc_heap_ptr_untyped);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)&p,(size_t)(pfVar2->super_native_object).super_object.heap_);
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&p);
  *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001c16f8;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar3 + 0x10),(gc_heap_ptr_untyped *)(local_110 + 0x10))
  ;
  function_object::construct_function(pfVar2,(gc_heap_ptr<mjs::gc_function> *)&p);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  pfVar2 = (function_object *)gc_heap_ptr_untyped::get(&c.super_gc_heap_ptr_untyped);
  function_object::get_prototype(&p,pfVar2);
  if (p.type_ == object) {
    pvVar3 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (*(int *)((long)pvVar3 + 0x20) < 1) {
      this = &value::object_value(&p)->super_gc_heap_ptr_untyped;
      plVar1 = (long *)gc_heap_ptr_untyped::get(this);
      plVar4 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar4 + 0x98))(&local_c8,plVar4,"constructor");
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)local_110,&c.super_gc_heap_ptr_untyped);
      value::value((value *)&get_bool_obj,(object_ptr *)local_110);
      (**(code **)(*plVar1 + 8))(plVar1,&local_c8,&get_bool_obj,2);
      value::~value((value *)&get_bool_obj);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_110);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
    }
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 0x10));
    plVar1 = (long *)gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
    plVar4 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar4 + 0x98))(&get_bool_obj,plVar4,"constructor");
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_c8,&c.super_gc_heap_ptr_untyped);
    value::value(&p,(object_ptr *)&local_c8);
    (**(code **)(*plVar1 + 8))(plVar1,&get_bool_obj,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&get_bool_obj);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&get_bool_obj,&global->super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              (&get_bool_obj.prototype.super_gc_heap_ptr_untyped,
               &prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_40,&prototype.super_gc_heap_ptr_untyped);
    plVar1 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar1 + 0x98))(&local_98,plVar1,"toString");
    make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_2::__2
              ((__2 *)&local_c8,&get_bool_obj);
    plVar1 = (long *)gc_heap_ptr_untyped::get(&local_40);
    make_raw_function((mjs *)&local_a8,global);
    pfVar2 = (function_object *)gc_heap_ptr_untyped::get(&local_a8);
    local_110._16_8_ = (slot *)0x0;
    local_f8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_110,(size_t)(pfVar2->super_native_object).super_object.heap_);
    pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_110);
    *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001c1738;
    make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_2::__2
              ((__2 *)((long)pvVar3 + 0x10),(anon_class_32_2_842af841 *)&local_c8);
    function_object::put_function
              (pfVar2,(gc_heap_ptr<mjs::gc_function> *)local_110,
               (gc_heap_ptr<mjs::gc_string> *)&local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_110 + 0x10),0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 0x10));
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_30,&local_a8);
    value::value(&p,(object_ptr *)&local_30);
    (**(code **)(*plVar1 + 8))(plVar1,&local_98,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_30);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
    make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_2::~__2((__2 *)&local_c8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_40,&prototype.super_gc_heap_ptr_untyped);
    plVar1 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar1 + 0x98))(&local_98,plVar1,"valueOf");
    make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_2::__2
              ((__2 *)&local_c8,&get_bool_obj);
    plVar1 = (long *)gc_heap_ptr_untyped::get(&local_40);
    make_raw_function((mjs *)&local_a8,global);
    pfVar2 = (function_object *)gc_heap_ptr_untyped::get(&local_a8);
    local_110._16_8_ = (slot *)0x0;
    local_f8 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_110,(size_t)(pfVar2->super_native_object).super_object.heap_);
    pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_110);
    *(undefined ***)((long)pvVar3 + 8) = &PTR_destroy_001c1778;
    make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_2::__2
              ((__2 *)((long)pvVar3 + 0x10),(anon_class_32_2_842af841 *)&local_c8);
    function_object::put_function
              (pfVar2,(gc_heap_ptr<mjs::gc_function> *)local_110,
               (gc_heap_ptr<mjs::gc_string> *)&local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_110 + 0x10),0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 0x10));
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_30,&local_a8);
    value::value(&p,(object_ptr *)&local_30);
    (**(code **)(*plVar1 + 8))(plVar1,&local_98,&p,2);
    value::~value(&p);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_30);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
    make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_2::~__2((__2 *)&local_c8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)__return_storage_ptr__,&c.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              (&(__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped,
               &prototype.super_gc_heap_ptr_untyped);
    make_boolean_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_2::~__2((__2 *)&get_bool_obj)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&c.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&prototype.super_gc_heap_ptr_untyped);
    return __return_storage_ptr__;
  }
  __assert_fail("p.type() == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x59,
                "void mjs::make_constructable(const gc_heap_ptr<global_object> &, gc_heap_ptr<function_object> &, const F &) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/boolean_object.cpp:47:35)]"
               );
}

Assistant:

global_object_create_result make_boolean_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();
    auto prototype = h.make<boolean_object>(string{h, "Boolean"}, global->object_prototype(), false);

    auto c = make_function(global, [](const value&, const std::vector<value>& args) {
        return value{!args.empty() && to_boolean(args.front())};
    },  prototype->class_name().unsafe_raw_get(), 1);
    make_constructable(global, c, [prototype](const value&, const std::vector<value>& args) {
        return value{new_boolean(prototype, !args.empty() && to_boolean(args.front()))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    auto get_bool_obj = [global, prototype](const value& this_) {
        global->validate_type(this_, prototype, "Boolean");
        return gc_heap_ptr<boolean_object>{this_.object_value()};
    };

    put_native_function(global, prototype, global->common_string("toString"), [get_bool_obj](const value& this_, const std::vector<value>&){
        auto o = get_bool_obj(this_);
        return value{string{o.heap(), o->boolean_value() ? L"true" : L"false"}};
    }, 0);

    put_native_function(global, prototype, global->common_string("valueOf"), [get_bool_obj](const value& this_, const std::vector<value>&){
        auto o = get_bool_obj(this_);
        return value{o->boolean_value()};
    }, 0);

    return { c, prototype };
}